

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStreamReporter.cc
# Opt level: O2

void __thiscall cppmetrics::OStreamReporter::report(OStreamReporter *this)

{
  _Rb_tree_node_base *p_Var1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  double dVar4;
  shared_ptr<cppmetrics::Snapshot> snapshot;
  Histogram local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
  local_60;
  
  Registry::get_counters_abi_cxx11_
            ((MMap<Counter> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    poVar2 = std::operator<<(this->m_output,(string *)(p_Var3 + 1));
    poVar2 = std::operator<<(poVar2,"\t");
    Counter::get_count(*(Counter **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,"\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Counter>_>_>_>
  ::~_Rb_tree(&local_60);
  Registry::get_gauges_abi_cxx11_
            ((MMap<Gauge> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Gauge>_>_>_>
               *)&local_60);
  Registry::get_meters_abi_cxx11_
            ((MMap<Meter> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    p_Var1 = p_Var3 + 1;
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    poVar2 = std::operator<<(poVar2,".count\t");
    Meter::get_count(*(Meter **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".mean\t");
    dVar4 = Meter::get_mean_rate(*(Meter **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".m1\t");
    dVar4 = Meter::get_m1_rate(*(Meter **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".m5\t");
    dVar4 = Meter::get_m5_rate(*(Meter **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".m15\t");
    dVar4 = Meter::get_m15_rate(*(Meter **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Meter>_>_>_>
               *)&local_60);
  Registry::get_histograms_abi_cxx11_
            ((MMap<Histogram> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    Histogram::get_snapshot(&local_70);
    p_Var1 = p_Var3 + 1;
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    poVar2 = std::operator<<(poVar2,".count\t");
    Histogram::get_count(*(Histogram **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".p75\t");
    dVar4 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x50))
                              ();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".p95\t");
    dVar4 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x58))
                              ();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".p99\t");
    dVar4 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x68))
                              ();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.m_reservoir);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Histogram>_>_>_>
               *)&local_60);
  Registry::get_timers_abi_cxx11_
            ((MMap<Timer> *)&local_60,
             (this->m_registry).super___shared_ptr<cppmetrics::Registry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    Timer::get_snapshot((Timer *)&local_70);
    p_Var1 = p_Var3 + 1;
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    poVar2 = std::operator<<(poVar2,".count\t");
    Timer::get_count(*(Timer **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".m1\t");
    dVar4 = Timer::get_m1_rate(*(Timer **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".m5\t");
    dVar4 = Timer::get_m5_rate(*(Timer **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".m15\t");
    dVar4 = Timer::get_m15_rate(*(Timer **)(p_Var3 + 2));
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".p75\t");
    dVar4 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x50))
                              ();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".p95\t");
    dVar4 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x58))
                              ();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(this->m_output,(string *)p_Var1);
    std::operator<<(poVar2,".p99\t");
    dVar4 = (double)(**(code **)(*(long *)local_70.m_counter.super___atomic_base<long>._M_i + 0x68))
                              ();
    poVar2 = std::ostream::_M_insert<double>(dVar4);
    std::operator<<(poVar2,"\n");
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.m_reservoir);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cppmetrics::Timer>_>_>_>
               *)&local_60);
  return;
}

Assistant:

void OStreamReporter::report()
{
  for (auto&& counter : m_registry->get_counters())
  {
    m_output << counter.first << "\t" << counter.second->get_count() << "\n";
  }

  for (auto&& gauge : m_registry->get_gauges())
  {
    //m_output << counter.first << "\t" << counter.second->
  }

  for (auto&& meter : m_registry->get_meters())
  {
    m_output << meter.first << ".count\t" << meter.second->get_count() << "\n";
    m_output << meter.first << ".mean\t" << meter.second->get_mean_rate() << "\n";
    m_output << meter.first << ".m1\t" << meter.second->get_m1_rate() << "\n";
    m_output << meter.first << ".m5\t" << meter.second->get_m5_rate() << "\n";
    m_output << meter.first << ".m15\t" << meter.second->get_m15_rate() << "\n";
  }

  for (auto&& histogram : m_registry->get_histograms())
  {
    auto snapshot = histogram.second->get_snapshot();
    m_output << histogram.first << ".count\t" << histogram.second->get_count() << "\n";
    m_output << histogram.first << ".p75\t" << snapshot->get_p75() << "\n";
    m_output << histogram.first << ".p95\t" << snapshot->get_p95() << "\n";
    m_output << histogram.first << ".p99\t" << snapshot->get_p99() << "\n";
  }

  for (auto&& timer : m_registry->get_timers())
  {
    auto snapshot = timer.second->get_snapshot();
    m_output << timer.first << ".count\t" << timer.second->get_count() << "\n";
    m_output << timer.first << ".m1\t" << timer.second->get_m1_rate() << "\n";
    m_output << timer.first << ".m5\t" << timer.second->get_m5_rate() << "\n";
    m_output << timer.first << ".m15\t" << timer.second->get_m15_rate() << "\n";
    m_output << timer.first << ".p75\t" << snapshot->get_p75() << "\n";
    m_output << timer.first << ".p95\t" << snapshot->get_p95() << "\n";
    m_output << timer.first << ".p99\t" << snapshot->get_p99() << "\n";
  }
}